

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int doMount(PHYSFS_Io *io,char *fname,char *mountPoint,int appendToPath)

{
  int iVar1;
  DirHandle *pDVar2;
  DirHandle *local_48;
  DirHandle *i;
  DirHandle *prev;
  DirHandle *dh;
  char *pcStack_28;
  int appendToPath_local;
  char *mountPoint_local;
  char *fname_local;
  PHYSFS_Io *io_local;
  
  i = (DirHandle *)0x0;
  if (fname == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    io_local._4_4_ = 0;
  }
  else {
    pcStack_28 = mountPoint;
    if (mountPoint == (char *)0x0) {
      pcStack_28 = "/";
    }
    __PHYSFS_platformGrabMutex(stateLock);
    for (local_48 = searchPath; local_48 != (DirHandle *)0x0; local_48 = local_48->next) {
      if ((local_48->dirName != (char *)0x0) &&
         (iVar1 = strcmp(fname,local_48->dirName), iVar1 == 0)) {
        __PHYSFS_platformReleaseMutex(stateLock);
        return 1;
      }
      i = local_48;
    }
    pDVar2 = createDirHandle(io,fname,pcStack_28,0);
    if (pDVar2 == (DirHandle *)0x0) {
      __PHYSFS_platformReleaseMutex(stateLock);
      io_local._4_4_ = 0;
    }
    else {
      if (appendToPath == 0) {
        pDVar2->next = searchPath;
      }
      else if (i != (DirHandle *)0x0) {
        i->next = pDVar2;
        pDVar2 = searchPath;
      }
      searchPath = pDVar2;
      __PHYSFS_platformReleaseMutex(stateLock);
      io_local._4_4_ = 1;
    }
  }
  return io_local._4_4_;
}

Assistant:

static int doMount(PHYSFS_Io *io, const char *fname,
                   const char *mountPoint, int appendToPath)
{
    DirHandle *dh;
    DirHandle *prev = NULL;
    DirHandle *i;

    BAIL_IF(!fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    if (mountPoint == NULL)
        mountPoint = "/";

    __PHYSFS_platformGrabMutex(stateLock);

    for (i = searchPath; i != NULL; i = i->next)
    {
        /* already in search path? */
        if ((i->dirName != NULL) && (strcmp(fname, i->dirName) == 0))
            BAIL_MUTEX_ERRPASS(stateLock, 1);
        prev = i;
    } /* for */

    dh = createDirHandle(io, fname, mountPoint, 0);
    BAIL_IF_MUTEX_ERRPASS(!dh, stateLock, 0);

    if (appendToPath)
    {
        if (prev == NULL)
            searchPath = dh;
        else
            prev->next = dh;
    } /* if */
    else
    {
        dh->next = searchPath;
        searchPath = dh;
    } /* else */

    __PHYSFS_platformReleaseMutex(stateLock);
    return 1;
}